

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

Promise<void> __thiscall
kj::Promise<void>::attach<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>
          (Promise<void> *this,String *attachments,
          Array<kj::ArrayPtr<const_unsigned_char>_> *attachments_1)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *next;
  kj *this_00;
  Array<kj::ArrayPtr<const_unsigned_char>_> *params;
  Array<kj::ArrayPtr<const_unsigned_char>_> *in_RCX;
  ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>
  local_68;
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>_>,_kj::_::PromiseDisposer>
  local_38;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_30;
  Array<kj::ArrayPtr<const_unsigned_char>_> *local_28;
  Array<kj::ArrayPtr<const_unsigned_char>_> *attachments_local_1;
  String *attachments_local;
  Promise<void> *this_local;
  
  local_28 = in_RCX;
  attachments_local_1 = attachments_1;
  attachments_local = attachments;
  this_local = this;
  next = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>
                   ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)attachments);
  this_00 = (kj *)fwd<kj::String>((NoInfer<kj::String> *)attachments_local_1);
  params = fwd<kj::Array<kj::ArrayPtr<unsigned_char_const>>>(local_28);
  tuple<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>
            (&local_68,this_00,(String *)params,in_RCX);
  kj::_::PromiseDisposer::
  appendPromise<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>>,kj::_::PromiseDisposer,kj::_::Tuple<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>>
            ((PromiseDisposer *)&local_38,next,&local_68);
  Own<kj::_::PromiseNode,kj::_::PromiseDisposer>::
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::String,kj::Array<kj::ArrayPtr<unsigned_char_const>>>>,void>
            ((Own<kj::_::PromiseNode,kj::_::PromiseDisposer> *)&local_30,&local_38);
  Promise(this,false,(OwnPromiseNode *)&local_30);
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::~Own(&local_30);
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>_>,_kj::_::PromiseDisposer>
  ::~Own(&local_38);
  kj::_::Tuple<kj::String,_kj::Array<kj::ArrayPtr<const_unsigned_char>_>_>::~Tuple(&local_68);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false,
      _::PromiseDisposer::appendPromise<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
          kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}